

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O0

bool __thiscall Js::SharedContents::IsValidAgent(SharedContents *this,DWORD_PTR agent)

{
  bool local_2d;
  AutoCriticalSection local_20;
  AutoCriticalSection autoCS;
  DWORD_PTR agent_local;
  SharedContents *this_local;
  
  autoCS.cs = (CriticalSection *)agent;
  AutoCriticalSection::AutoCriticalSection(&local_20,&this->csAgent);
  local_2d = false;
  if (this->allowedAgents != (SharableAgents *)0x0) {
    local_2d = JsUtil::ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>::Contains
                         (&this->allowedAgents->
                           super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>
                          ,(unsigned_long *)&autoCS);
  }
  AutoCriticalSection::~AutoCriticalSection(&local_20);
  return local_2d;
}

Assistant:

bool SharedContents::IsValidAgent(DWORD_PTR agent)
    {
        AutoCriticalSection autoCS(&csAgent);
        return allowedAgents != nullptr && allowedAgents->Contains(agent);
    }